

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGhsMultiGenerator::Generate(cmGlobalGhsMultiGenerator *this)

{
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  string *psVar3;
  cmGlobalGhsMultiGenerator *pcVar4;
  string fname;
  cmGeneratedFileStream ftarget;
  cmGeneratedFileStream frule;
  string local_510;
  undefined1 local_4f0 [616];
  _func_int **local_288;
  _Alloc_hider local_278;
  
  local_510._M_string_length = 0;
  local_510.field_2._M_local_buf[0] = '\0';
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  cmGlobalGenerator::Generate(&this->super_cmGlobalGenerator);
  for (p_Var2 = (this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    OutputTopLevelProject
              (this,(cmLocalGenerator *)**(undefined8 **)(p_Var2 + 2),
               (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)(p_Var2 + 2));
  }
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_288 = (_func_int **)&stack0xfffffffffffffd88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffd78,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&stack0xfffffffffffffd78);
  std::__cxx11::string::operator=((string *)&local_510,(string *)&stack0xfffffffffffffd78);
  if ((_Alloc_hider *)local_288 != &stack0xfffffffffffffd88) {
    operator_delete(local_288,(ulong)(local_278._M_p + 1));
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&stack0xfffffffffffffd78,&local_510,false,None);
  pcVar4 = (cmGlobalGhsMultiGenerator *)&stack0xfffffffffffffd78;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar4,true);
  WriteFileHeader(pcVar4,(ostream *)&stack0xfffffffffffffd78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&stack0xfffffffffffffd78,
             "Commands {\n  Custom_Rule_Command {\n    name = \"Custom Rule Command\"\n    exec = \"/bin/sh\"\n    options = {\"SpecialOptions\"}\n  }\n}\n\n\nFileTypes {\n  CmakeRule {\n    name = \"Custom Rule\"\n    action = \"&Run\"\n    extensions = {\"sh\"}\n    grepable = false\n    command = \"Custom Rule Command\"\n    commandLine = \"$COMMAND  $INPUTFILE\"\n    progress = \"Processing Custom Rule\"\n    promoteToFirstPass = true\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
             ,0x1bd);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)&stack0xfffffffffffffd78);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_4f0._0_8_ = local_4f0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f0,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append(local_4f0);
  std::__cxx11::string::operator=((string *)&local_510,(string *)local_4f0);
  if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
    operator_delete((void *)local_4f0._0_8_,(ulong)(local_4f0._16_8_ + 1));
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4f0,&local_510,false,None);
  pcVar4 = (cmGlobalGhsMultiGenerator *)local_4f0;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar4,true);
  WriteFileHeader(pcVar4,(ostream *)local_4f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4f0,
             "FileTypes {\n  CmakeTarget {\n    name = \"Custom Target\"\n    action = \"&Execute\"\n    grepable = false\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
             ,0x98);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_4f0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4f0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&stack0xfffffffffffffd78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,
                    CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                             local_510.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::Generate()
{
  std::string fname;

  // first do the superclass method
  this->cmGlobalGenerator::Generate();

  // output top-level projects
  for (auto& it : this->ProjectMap) {
    this->OutputTopLevelProject(it.second[0], it.second);
  }

  // create custom rule BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_rule.bod";
  cmGeneratedFileStream frule(fname);
  frule.SetCopyIfDifferent(true);
  this->WriteFileHeader(frule);
  this->WriteCustomRuleBOD(frule);
  frule.Close();

  // create custom target BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_target.bod";
  cmGeneratedFileStream ftarget(fname);
  ftarget.SetCopyIfDifferent(true);
  this->WriteFileHeader(ftarget);
  this->WriteCustomTargetBOD(ftarget);
  ftarget.Close();
}